

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_RemoveChildren
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  bool bVar2;
  AActor *removetarget;
  AActor *pAVar3;
  AActor *this;
  char *pcVar4;
  PClassActor *filter;
  TThinkerIterator<AActor> it;
  int local_50;
  FName local_4c;
  FThinkerIterator local_48;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003ef760;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003ef731:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003ef760:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x187f,
                  "int AF_AActor_A_RemoveChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003ef5d1;
    bVar2 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003ef760;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_003ef731;
LAB_003ef5d1:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ef7b0:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1880,
                    "int AF_AActor_A_RemoveChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    bVar2 = param[1].field_0.i == 0;
LAB_003ef634:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ef7cf:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1881,
                    "int AF_AActor_A_RemoveChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_50 = param[2].field_0.i;
LAB_003ef647:
    if (param[3].field_0.field_3.Type != '\x03') {
LAB_003ef73a:
      pcVar4 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003ef741:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1882,
                    "int AF_AActor_A_RemoveChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    filter = (PClassActor *)param[3].field_0.field_1.a;
    if (param[3].field_0.field_1.atag != 1) {
      if (filter != (PClassActor *)0x0) goto LAB_003ef73a;
      filter = (PClassActor *)0x0;
    }
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ef7b0;
    }
    bVar2 = param[1].field_0.i == 0;
    if ((uint)numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003ef634;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ef7cf;
    }
    local_50 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003ef647;
    }
    if ((param[3].field_0.field_3.Type != '\x03') ||
       (filter = (PClassActor *)param[3].field_0.field_1.a,
       filter != (PClassActor *)0x0 && param[3].field_0.field_1.atag != 1)) {
      pcVar4 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003ef741;
    }
    if (4 < (uint)numparam) {
      if (param[4].field_0.field_3.Type != '\0') {
        pcVar4 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003ef77f;
      }
      goto LAB_003ef674;
    }
    param = defaultparam->Array;
  }
  if (param[4].field_0.field_3.Type != '\0') {
    pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ef77f:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1883,
                  "int AF_AActor_A_RemoveChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003ef674:
  iVar1 = param[4].field_0.i;
  TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&local_48,0x80);
  while( true ) {
    removetarget = (AActor *)FThinkerIterator::Next(&local_48,false);
    if (removetarget == (AActor *)0x0) break;
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)&removetarget->master);
    if ((pAVar3 == this) && (!(bool)(0 < removetarget->health & bVar2))) {
      local_4c.Index = iVar1;
      DoRemove(removetarget,local_50,filter,&local_4c);
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RemoveChildren)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL_DEF(removeall);
	PARAM_INT_DEF(flags);
	PARAM_CLASS_DEF(filter, AActor);
	PARAM_NAME_DEF(species);

	TThinkerIterator<AActor> it;
	AActor *mo;

	while ((mo = it.Next()) != NULL)
	{
		if (mo->master == self && (mo->health <= 0 || removeall))
		{
			DoRemove(mo, flags, filter, species);
		}
	}
	return 0;
}